

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCacheClear(Parse *pParse)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    iVar2 = *(int *)((long)&pParse->aColCache[0].iReg + lVar3);
    if (iVar2 != 0) {
      if ((&pParse->aColCache[0].tempReg)[lVar3] != '\0') {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = iVar2;
        }
        (&pParse->aColCache[0].tempReg)[lVar3] = '\0';
      }
      *(undefined4 *)((long)&pParse->aColCache[0].iReg + lVar3) = 0;
    }
    lVar3 = lVar3 + 0x18;
  } while ((int)lVar3 != 0xf0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheClear(Parse *pParse){
  int i;
  struct yColCache *p;

  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    if( p->iReg ){
      cacheEntryClear(pParse, p);
      p->iReg = 0;
    }
  }
}